

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::PageHeader::read(PageHeader *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  ssize_t sVar6;
  undefined8 uVar7;
  void *__buf_00;
  int __fd_00;
  undefined4 in_register_00000034;
  int32_t ecast86;
  bool isset_compressed_page_size;
  bool isset_uncompressed_page_size;
  bool isset_type;
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  undefined4 in_stack_ffffffffffffff08;
  TProtocolExceptionType in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  string *in_stack_ffffffffffffff18;
  TProtocol *in_stack_ffffffffffffff20;
  type local_5c;
  undefined2 local_46;
  int local_44;
  string local_40 [36];
  uint local_1c;
  undefined8 local_10;
  PageHeader *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  duckdb_apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
             ,(TProtocol *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_1c = 0;
  std::__cxx11::string::string(local_40);
  uVar4 = duckdb_apache::thrift::protocol::TProtocol::readStructBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_1c = uVar4 + local_1c;
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  while( true ) {
    uVar4 = duckdb_apache::thrift::protocol::TProtocol::readFieldBegin
                      (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                       (TType *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (int16_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    local_1c = uVar4 + local_1c;
    if (local_44 == 0) break;
    __fd_00 = (int)local_10;
    switch(local_46) {
    case 1:
      if (local_44 == 8) {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
        ;
        local_1c = uVar4 + local_1c;
        this->type = local_5c;
        bVar1 = true;
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar4 + local_1c;
      }
      break;
    case 2:
      if (local_44 == 8) {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
        ;
        local_1c = uVar4 + local_1c;
        bVar2 = true;
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar4 + local_1c;
      }
      break;
    case 3:
      if (local_44 == 8) {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
        ;
        local_1c = uVar4 + local_1c;
        bVar3 = true;
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar4 + local_1c;
      }
      break;
    case 4:
      if (local_44 == 8) {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
        ;
        local_1c = uVar4 + local_1c;
        this->__isset = (_PageHeader__isset)((byte)this->__isset & 0xfe | 1);
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar4 + local_1c;
      }
      break;
    case 5:
      if (local_44 == 0xc) {
        sVar6 = DataPageHeader::read(&this->data_page_header,__fd_00,__buf_00,0xa9db34);
        local_1c = (int)sVar6 + local_1c;
        this->__isset = (_PageHeader__isset)((byte)this->__isset & 0xfd | 2);
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar4 + local_1c;
      }
      break;
    case 6:
      if (local_44 == 0xc) {
        sVar6 = IndexPageHeader::read(&this->index_page_header,__fd_00,__buf_00,0xa9db34);
        local_1c = (int)sVar6 + local_1c;
        this->__isset = (_PageHeader__isset)((byte)this->__isset & 0xfb | 4);
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar4 + local_1c;
      }
      break;
    case 7:
      if (local_44 == 0xc) {
        sVar6 = DictionaryPageHeader::read(&this->dictionary_page_header,__fd_00,__buf_00,0xa9db34);
        local_1c = (int)sVar6 + local_1c;
        this->__isset = (_PageHeader__isset)((byte)this->__isset & 0xf7 | 8);
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar4 + local_1c;
      }
      break;
    case 8:
      if (local_44 == 0xc) {
        sVar6 = DataPageHeaderV2::read(&this->data_page_header_v2,__fd_00,__buf_00,0xa9db34);
        local_1c = (int)sVar6 + local_1c;
        this->__isset = (_PageHeader__isset)((byte)this->__isset & 0xef | 0x10);
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar4 + local_1c;
      }
      break;
    default:
      uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                        ((TProtocol *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         in_stack_ffffffffffffff0c);
      local_1c = uVar4 + local_1c;
    }
    uVar4 = duckdb_apache::thrift::protocol::TProtocol::readFieldEnd((TProtocol *)0x70a40a);
    local_1c = uVar4 + local_1c;
  }
  uVar4 = duckdb_apache::thrift::protocol::TProtocol::readStructEnd((TProtocol *)0x70a434);
  uVar5 = uVar4 + local_1c;
  local_1c = uVar5;
  if (!bVar1) {
    uVar7 = __cxa_allocate_exception(0x30);
    duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
              ((TProtocolException *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff0c);
    __cxa_throw(uVar7,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  if (!bVar2) {
    uVar7 = __cxa_allocate_exception(0x30);
    duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
              ((TProtocolException *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff0c);
    __cxa_throw(uVar7,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  if (bVar3) {
    std::__cxx11::string::~string(local_40);
    duckdb_apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
              ((TInputRecursionTracker *)0x70a5ac);
    return (ulong)uVar5;
  }
  uVar7 = __cxa_allocate_exception(0x30);
  duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
            ((TProtocolException *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff0c);
  __cxa_throw(uVar7,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
              duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
}

Assistant:

uint32_t PageHeader::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_type = false;
  bool isset_uncompressed_page_size = false;
  bool isset_compressed_page_size = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast86;
          xfer += iprot->readI32(ecast86);
          this->type = static_cast<PageType::type>(ecast86);
          isset_type = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->uncompressed_page_size);
          isset_uncompressed_page_size = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->compressed_page_size);
          isset_compressed_page_size = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->crc);
          this->__isset.crc = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->data_page_header.read(iprot);
          this->__isset.data_page_header = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->index_page_header.read(iprot);
          this->__isset.index_page_header = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->dictionary_page_header.read(iprot);
          this->__isset.dictionary_page_header = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->data_page_header_v2.read(iprot);
          this->__isset.data_page_header_v2 = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_type)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_uncompressed_page_size)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_compressed_page_size)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}